

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O1

void __thiscall cursespp::ShortcutsWindow::OnFocusChanged(ShortcutsWindow *this,bool focused)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,focused) != 0) {
    std::__cxx11::string::_M_assign((string *)&this->originalKey);
    return;
  }
  if ((this->originalKey)._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->activeKey);
    std::__cxx11::string::_M_replace
              ((ulong)&this->originalKey,0,(char *)(this->originalKey)._M_string_length,0x188174);
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[5])(this);
    return;
  }
  return;
}

Assistant:

void ShortcutsWindow::OnFocusChanged(bool focused) {
    if (focused) {
        this->originalKey = this->activeKey;
    }
    else {
        if (this->originalKey.size()) {
            this->activeKey = this->originalKey;
            this->originalKey = "";
            this->Redraw();
        }
    }
}